

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O2

void __thiscall
hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::read_preamble
          (File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *this)

{
  bool bVar1;
  unsigned_long uVar2;
  runtime_error *prVar3;
  size_t read_bytes;
  array<char,_8UL> read_magic_bytes;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  read_magic_bytes =
       File<hta::storage::file::Metric::Header,hta::TimeAggregate>::read<std::array<char,8ul>>
                 ((File<hta::storage::file::Metric::Header,hta::TimeAggregate> *)this);
  bVar1 = Catch::clara::std::__equal<true>::equal<char>
                    (read_magic_bytes._M_elems,(char *)&local_88,magic_bytes._M_elems);
  if (!bVar1) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    s_abi_cxx11_(&local_68,"Magic bytes of file do not match. Invalid or corrupt file:",0x3a);
    std::filesystem::__cxx11::path::string(&local_88,&this->filename_);
    std::operator+(&local_48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88);
    std::runtime_error::runtime_error(prVar3,(string *)&local_48);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar2 = read<unsigned_long>(this);
  if (uVar2 == 0xf8f9fafbfcfdfeff) {
    uVar2 = read<unsigned_long>(this);
    (this->data_begin_)._M_off = uVar2 + 0x18;
    (this->data_begin_)._M_state.__count = 0;
    (this->data_begin_)._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
    read_bytes = 0x38;
    if (uVar2 < 0x38) {
      read_bytes = uVar2;
    }
    std::istream::seekg(&this->stream_,0x18,0);
    check_stream(this,"seekg header");
    std::istream::read((char *)&this->stream_,(long)&this->header_);
    check_stream(this,"read header");
    Metric::Header::restore(&this->header_,read_bytes);
    return;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  s_abi_cxx11_(&local_68,"Byte order mark does not match. File written with different endianess: ",
               0x47);
  std::filesystem::__cxx11::path::string(&local_88,&this->filename_);
  std::operator+(&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88);
  std::runtime_error::runtime_error(prVar3,(string *)&local_48);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void read_preamble()
    {
        const auto read_magic_bytes = read<std::array<char, 8>>();
        if (!std::equal(read_magic_bytes.begin(), read_magic_bytes.end(), magic_bytes.begin()))
        {
            throw std::runtime_error("Magic bytes of file do not match. Invalid or corrupt file:"s +
                                     filename_.string());
        }
        const auto read_bom = read<uint64_t>();
        if (read_bom != byte_order_mark)
        {
            throw std::runtime_error("Byte order mark does not match. File written with "
                                     "different endianess: "s +
                                     filename_.string());
        }

        const auto header_size = read<uint64_t>();
        data_begin_ = header_begin_ + header_size;

        auto read_size =
            std::min<size_t>(sizeof(header_), data_begin_ - static_cast<pos_type>(header_begin_));
        stream_.seekg(header_begin_);
        check_stream("seekg header");
        stream_.read(reinterpret_cast<char*>(&header_), read_size);
        check_stream("read header");
        header_.restore(read_size);
    }